

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QConfFile_*>_>::rehash
          (Data<QHashPrivate::Node<QString,_QConfFile_*>_> *this,size_t sizeHint)

{
  ulong uVar1;
  long lVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  long lVar6;
  Span<QHashPrivate::Node<QString,_QConfFile_*>_> *this_00;
  Node<QString,_QConfFile_*> *pNVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  size_t index;
  size_t sVar11;
  long lVar12;
  QStringView key;
  R_conflict8 RVar13;
  Bucket BVar14;
  
  if (sizeHint == 0) {
    sizeHint = *(size_t *)(this + 8);
  }
  sVar11 = 0x80;
  if ((0x40 < sizeHint) && (sVar11 = 0xffffffffffffffff, sizeHint < 0x4000000000000000)) {
    lVar6 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar11 = 1L << (0x41 - ((byte)lVar6 ^ 0x3f) & 0x3f);
  }
  uVar1 = *(ulong *)(this + 0x10);
  lVar6 = *(long *)(this + 0x20);
  RVar13 = allocateSpans(sVar11);
  *(Span **)(this + 0x20) = RVar13.spans;
  *(size_t *)(this + 0x10) = sVar11;
  if (uVar1 < 0x80) {
    if (lVar6 == 0) {
      return;
    }
  }
  else {
    uVar8 = 0;
    lVar10 = lVar6;
    do {
      this_00 = (Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)(uVar8 * 0x90 + lVar6);
      lVar12 = 0;
      do {
        if (*(byte *)(lVar10 + lVar12) != 0xff) {
          lVar2 = *(long *)(this_00 + 0x80);
          lVar9 = (ulong)*(byte *)(lVar10 + lVar12) * 0x20;
          key.m_data = *(storage_type_conflict **)(lVar2 + 8 + lVar9);
          key.m_size = *(qsizetype *)(lVar2 + 0x10 + lVar9);
          sVar11 = ::qHash(key,*(size_t *)(this + 0x18));
          BVar14 = findBucketWithHash<QString>(this,(QString *)(lVar9 + lVar2),sVar11);
          pNVar7 = Span<QHashPrivate::Node<QString,_QConfFile_*>_>::insert
                             ((Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)BVar14.span,
                              BVar14.index);
          pDVar3 = *(Data **)(lVar2 + lVar9);
          *(undefined8 *)(lVar2 + lVar9) = 0;
          (pNVar7->key).d.d = pDVar3;
          pcVar4 = *(char16_t **)(lVar2 + 8 + lVar9);
          *(undefined8 *)(lVar2 + 8 + lVar9) = 0;
          (pNVar7->key).d.ptr = pcVar4;
          qVar5 = *(qsizetype *)(lVar2 + 0x10 + lVar9);
          *(undefined8 *)(lVar2 + 0x10 + lVar9) = 0;
          (pNVar7->key).d.size = qVar5;
          pNVar7->value = *(QConfFile **)(lVar2 + 0x18 + lVar9);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      Span<QHashPrivate::Node<QString,_QConfFile_*>_>::freeData(this_00);
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 0x90;
    } while (uVar8 != uVar1 >> 7);
  }
  lVar10 = *(long *)(lVar6 + -8);
  if (lVar10 != 0) {
    lVar12 = lVar10 * 0x90;
    do {
      Span<QHashPrivate::Node<QString,_QConfFile_*>_>::freeData
                ((Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)(lVar12 + lVar6 + -0x90));
      lVar12 = lVar12 + -0x90;
    } while (lVar12 != 0);
  }
  operator_delete__((void *)(lVar6 + -8),lVar10 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }